

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O3

UInt32 crnlib::Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  UInt32 curMatch;
  byte *cur;
  CLzRef *pCVar1;
  UInt32 UVar2;
  long lVar3;
  UInt32 *pUVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  UInt32 UVar9;
  
  UVar2 = p->lenLimit;
  if (UVar2 < 3) {
    MatchFinder_MovePos(p);
    UVar9 = 0;
  }
  else {
    cur = p->buffer;
    uVar6 = (uint)cur[1] ^ p->crc[*cur];
    uVar7 = uVar6 & 0x3ff;
    UVar9 = p->pos;
    pCVar1 = p->hash;
    uVar5 = UVar9 - pCVar1[uVar7];
    uVar6 = (((uint)cur[2] << 8 ^ uVar6) & p->hashMask) + 0x400;
    curMatch = pCVar1[uVar6];
    pCVar1[uVar6] = UVar9;
    pCVar1[uVar7] = UVar9;
    UVar9 = p->cyclicBufferSize;
    lVar3 = 2;
    if ((uVar5 < UVar9) && (cur[-(ulong)uVar5] == *cur)) {
      lVar3 = 2;
      do {
        if ((cur + -(ulong)uVar5)[lVar3] != cur[lVar3]) {
          *distances = (UInt32)lVar3;
          distances[1] = uVar5 - 1;
          UVar9 = p->cyclicBufferSize;
          lVar8 = 2;
          goto LAB_001a5d4e;
        }
        lVar3 = lVar3 + 1;
      } while (UVar2 != (UInt32)lVar3);
      *distances = UVar2;
      distances[1] = uVar5 - 1;
      SkipMatchesSpec(UVar2,curMatch,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar2 = p->pos + 1;
      p->pos = UVar2;
      UVar9 = 2;
    }
    else {
      lVar8 = 0;
LAB_001a5d4e:
      pUVar4 = GetMatchesSpec1(UVar2,curMatch,p->pos,cur,p->son,p->cyclicBufferPos,UVar9,p->cutValue
                               ,distances + lVar8,(UInt32)lVar3);
      UVar9 = (UInt32)((ulong)((long)pUVar4 - (long)distances) >> 2);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar2 = p->pos + 1;
      p->pos = UVar2;
    }
    if (UVar2 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return UVar9;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, delta2, maxLen, offset;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  curMatch = p->hash[kFix3HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hashValue] = p->pos;

  maxLen = 2;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[0] = maxLen;
    distances[1] = delta2 - 1;
    offset = 2;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  GET_MATCHES_FOOTER(offset, maxLen)
}